

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.h
# Opt level: O2

bool mocker::detail::runOptPassImpl<mocker::PromoteGlobalVariables>
               (Module *module,ModulePass *param_2)

{
  bool bVar1;
  PromoteGlobalVariables local_c0;
  
  PromoteGlobalVariables::PromoteGlobalVariables(&local_c0,module);
  bVar1 = PromoteGlobalVariables::operator()(&local_c0);
  PromoteGlobalVariables::~PromoteGlobalVariables(&local_c0);
  return bVar1;
}

Assistant:

bool runOptPassImpl(ir::Module &module, ModulePass *, Args &&... args) {
  return Pass{module, std::forward<Args>(args)...}();
}